

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O3

char * ARM_reg_name2(csh handle,uint reg)

{
  if (0x6e < reg) {
    return (char *)0x0;
  }
  return reg_name_maps2[reg].name;
}

Assistant:

const char *ARM_reg_name2(csh handle, unsigned int reg)
{
#ifndef CAPSTONE_DIET
	if (reg >= ARM_REG_ENDING)
		return NULL;

	return reg_name_maps2[reg].name;
#else
	return NULL;
#endif
}